

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O3

bool WTF::ParseName(State *state)

{
  undefined2 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar2;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  int iVar11;
  short sVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  short sVar18;
  char *pcVar19;
  State copy;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  pcVar5 = state->mangled_cur;
  pcVar7 = state->out_cur;
  pcVar8 = state->out_begin;
  pcVar9 = state->out_end;
  uVar10 = *(undefined8 *)((long)&state->prev_name + 4);
  uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)&state->out_end + 4) >> 0x20);
  local_3c = (undefined4)((ulong)pcVar9 >> 0x20);
  uVar1 = state->nest_level;
  uVar3 = state->append;
  uVar4 = state->overflowed;
  if (*state->mangled_cur == 'N') {
    state->mangled_cur = state->mangled_cur + 1;
    state->nest_level = 0;
    ParseCVQualifiers(state);
    do {
      sVar18 = state->nest_level;
      bVar15 = false;
      while( true ) {
        if (0 < sVar18) {
          MaybeAppend(state,"::");
        }
        bVar14 = ParseTemplateParam(state);
        if (((!bVar14) && (bVar14 = ParseSubstitution(state), !bVar14)) &&
           (bVar14 = ParseUnscopedName(state), !bVar14)) break;
        sVar18 = state->nest_level;
        bVar15 = true;
        if (-1 < sVar18) {
          sVar18 = sVar18 + 1;
          state->nest_level = sVar18;
        }
      }
      if (((0 < state->nest_level) && (state->append == true)) &&
         (pcVar19 = state->out_cur + -2, state->out_begin <= pcVar19)) {
        state->out_cur = pcVar19;
        *pcVar19 = '\0';
      }
    } while ((bVar15) && (bVar15 = ParseTemplateArgs(state), bVar15));
    state->nest_level = uVar1;
    if (*state->mangled_cur == 'E') {
      state->mangled_cur = state->mangled_cur + 1;
      return true;
    }
  }
  *(ulong *)((long)&state->out_end + 4) = CONCAT44(uStack_38,local_3c);
  *(undefined8 *)((long)&state->prev_name + 4) = uVar10;
  state->out_begin = pcVar8;
  state->out_end = pcVar9;
  state->mangled_cur = pcVar5;
  state->out_cur = pcVar7;
  state->nest_level = uVar1;
  state->append = (bool)uVar3;
  state->overflowed = (bool)uVar4;
  pcVar7 = state->mangled_cur;
  pcVar8 = state->out_cur;
  pcVar9 = state->out_begin;
  pcVar19 = state->out_end;
  pcVar5 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar18 = state->nest_level;
  bVar15 = state->append;
  bVar14 = state->overflowed;
  iVar11 = state->prev_name_length;
  sVar12 = state->nest_level;
  bVar17 = state->append;
  bVar13 = state->overflowed;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar16 = ParseEncoding(state);
    if ((bVar16) && (*state->mangled_cur == 'E')) {
      state->mangled_cur = state->mangled_cur + 1;
      MaybeAppend(state,"::");
      bVar16 = ParseName(state);
      if (bVar16) goto LAB_001075f1;
    }
  }
  state->mangled_cur = pcVar7;
  state->out_cur = pcVar8;
  state->prev_name = pcVar5;
  state->prev_name_length = iVar2;
  state->nest_level = sVar18;
  state->append = bVar15;
  state->overflowed = bVar14;
  state->out_begin = pcVar9;
  state->out_end = pcVar19;
  if (*state->mangled_cur == 'Z') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar15 = ParseEncoding(state);
    if (((bVar15) && (pcVar6 = state->mangled_cur, *pcVar6 == 'E')) && (pcVar6[1] == 's')) {
      state->mangled_cur = pcVar6 + 2;
LAB_001075f1:
      ParseDiscriminator(state);
      return true;
    }
  }
  state->prev_name = pcVar5;
  state->prev_name_length = iVar11;
  state->nest_level = sVar12;
  state->append = bVar17;
  state->overflowed = bVar13;
  state->out_begin = pcVar9;
  state->out_end = pcVar19;
  state->mangled_cur = pcVar7;
  state->out_cur = pcVar8;
  pcVar7 = state->mangled_cur;
  pcVar8 = state->out_cur;
  pcVar9 = state->out_begin;
  pcVar19 = state->out_end;
  pcVar5 = state->prev_name;
  iVar2 = state->prev_name_length;
  sVar18 = state->nest_level;
  bVar15 = state->append;
  bVar14 = state->overflowed;
  bVar17 = ParseUnscopedName(state);
  if (((bVar17) || (bVar17 = ParseSubstitution(state), bVar17)) &&
     (bVar17 = ParseTemplateArgs(state), bVar17)) {
    return true;
  }
  state->prev_name = pcVar5;
  state->prev_name_length = iVar2;
  state->nest_level = sVar18;
  state->append = bVar15;
  state->overflowed = bVar14;
  state->out_begin = pcVar9;
  state->out_end = pcVar19;
  state->mangled_cur = pcVar7;
  state->out_cur = pcVar8;
  bVar15 = ParseUnscopedName(state);
  return bVar15;
}

Assistant:

static bool ParseName(State *state) {
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseUnscopedTemplateName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <unscoped-template-name> <template-args>.
  if (ParseUnscopedName(state)) {
    return true;
  }
  return false;
}